

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphMaker.cc
# Opt level: O1

void __thiscall
GraphMaker::new_graph_from_paired_datastore
          (GraphMaker *this,PairedReadsDatastore *ds,int k,int min_coverage,int num_batches)

{
  vector<unsigned___int128,_std::allocator<unsigned___int128>_> local_30;
  
  BatchKmersCounter::countKmersToList(&local_30,ds,k,min_coverage,num_batches);
  new_graph_from_kmerlist_128(this,&local_30,(uint8_t)k);
  if (local_30.super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.
                    super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_30.
                          super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.
                          super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void GraphMaker::new_graph_from_paired_datastore(const PairedReadsDatastore& ds,  int k, int min_coverage, int num_batches) {
    new_graph_from_kmerlist_128(BatchKmersCounter::countKmersToList(ds, k, min_coverage, num_batches),k);
}